

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

uint rtosc_narguments(char *msg)

{
  char *pcVar1;
  char *in_RDI;
  bool bVar2;
  int nargs;
  char *args;
  uint local_14;
  char *local_10;
  
  local_10 = rtosc_argument_string(in_RDI);
  local_14 = 0;
  while (pcVar1 = local_10 + 1, *local_10 != '\0') {
    bVar2 = true;
    if (*pcVar1 != ']') {
      bVar2 = *pcVar1 == '[';
    }
    local_14 = !bVar2 + local_14;
    local_10 = pcVar1;
  }
  return local_14;
}

Assistant:

unsigned rtosc_narguments(const char *msg)
{
    const char *args = rtosc_argument_string(msg);
    int nargs = 0;
    while(*args++)
        nargs += (*args == ']' || *args == '[') ? 0 : 1;
    return nargs;
}